

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

bool Search::cached_action_store_or_find
               (search_private *priv,ptag mytag,ptag *condition_on,char *condition_on_names,
               action_repr *condition_on_actions,size_t condition_on_cnt,int policy,
               size_t learner_id,action *a,bool do_store,float *a_cost)

{
  float fVar1;
  uint64_t hash;
  scored_action *psVar2;
  uchar *puVar3;
  size_t sVar4;
  size_t nmemb;
  uchar *item;
  uchar *local_48;
  search_private *local_40;
  scored_action local_38;
  
  if ((mytag != 0) && (priv->no_caching == false)) {
    nmemb = (condition_on_cnt * 9 & 0xfffffffffffffffc) + 0x24;
    if ((condition_on_cnt * 9 & 3) == 0) {
      nmemb = condition_on_cnt * 9 + 0x20;
    }
    local_40 = priv;
    local_48 = calloc_or_throw<unsigned_char>(nmemb);
    *local_48 = (uchar)nmemb;
    local_48[8] = (uchar)mytag;
    local_48[0xc] = (uchar)policy;
    local_48[0x10] = (uchar)learner_id;
    local_48[0x18] = (uchar)condition_on_cnt;
    puVar3 = local_48 + 0x20;
    for (sVar4 = 0; condition_on_cnt != sVar4; sVar4 = sVar4 + 1) {
      *puVar3 = (uchar)condition_on[sVar4];
      puVar3[4] = (uchar)condition_on_actions->a;
      puVar3[8] = condition_on_names[sVar4];
      puVar3 = puVar3 + 9;
      condition_on_actions = condition_on_actions + 1;
    }
    hash = uniform_hash(local_48,nmemb,0xd5b);
    if (do_store) {
      local_38.a = *a;
      local_38.s = *a_cost;
      v_hashmap<unsigned_char_*,_Search::scored_action>::put
                (&local_40->cache_hash_map,&local_48,hash,&local_38);
      do_store = true;
    }
    else {
      psVar2 = v_hashmap<unsigned_char_*,_Search::scored_action>::get
                         (&local_40->cache_hash_map,&local_48,hash);
      fVar1 = psVar2->s;
      *a = psVar2->a;
      *a_cost = fVar1;
      free(local_48);
      do_store = *a != 0xffffffff;
    }
  }
  return do_store;
}

Assistant:

bool cached_action_store_or_find(search_private& priv, ptag mytag, const ptag* condition_on,
    const char* condition_on_names, action_repr* condition_on_actions, size_t condition_on_cnt, int policy,
    size_t learner_id, action& a, bool do_store, float& a_cost)
{
  if (priv.no_caching)
    return do_store;
  if (mytag == 0)
    return do_store;  // don't attempt to cache when tag is zero

  size_t sz = sizeof(size_t) + sizeof(ptag) + sizeof(int) + sizeof(size_t) + sizeof(size_t) +
      condition_on_cnt * (sizeof(ptag) + sizeof(action) + sizeof(char));
  if (sz % 4 != 0)
    sz += 4 - (sz % 4);  // make sure sz aligns to 4 so that uniform_hash does the right thing

  unsigned char* item = calloc_or_throw<unsigned char>(sz);
  unsigned char* here = item;
  *here = (unsigned char)sz;
  here += sizeof(size_t);
  *here = mytag;
  here += sizeof(ptag);
  *here = policy;
  here += sizeof(int);
  *here = (unsigned char)learner_id;
  here += sizeof(size_t);
  *here = (unsigned char)condition_on_cnt;
  here += sizeof(size_t);
  for (size_t i = 0; i < condition_on_cnt; i++)
  {
    *here = condition_on[i];
    here += sizeof(ptag);
    *here = condition_on_actions[i].a;
    here += sizeof(action);
    *here = condition_on_names[i];
    here += sizeof(char);  // SPEEDUP: should we align this at 4?
  }
  uint64_t hash = uniform_hash(item, sz, 3419);

  if (do_store)
  {
    priv.cache_hash_map.put(item, hash, scored_action(a, a_cost));
    return true;
  }
  else  // its a find
  {
    scored_action sa = priv.cache_hash_map.get(item, hash);
    a = sa.a;
    a_cost = sa.s;
    free(item);
    return a != (action)-1;
  }
}